

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

pair<int,_int> embree::quad_index3(int a0,int a1,int a2,int b0,int b1,int b2)

{
  pair<int,_int> pVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  int a0_00;
  undefined8 in_stack_fffffffffffffff8;
  int p;
  
  a0_00 = (int)in_stack_fffffffffffffff8;
  p = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  if (in_ECX == in_EDI) {
    pVar1 = quad_index2(p,a0_00,in_EDI,in_ESI,in_EDX);
  }
  else if (in_ECX == in_ESI) {
    pVar1 = quad_index2(p,a0_00,in_EDI,in_ESI,in_EDX);
  }
  else if (in_ECX == in_EDX) {
    pVar1 = quad_index2(p,a0_00,in_EDI,in_ESI,in_EDX);
  }
  else if (in_R8D == in_EDI) {
    pVar1 = quad_index2(p,a0_00,in_EDI,in_ESI,in_EDX);
  }
  else if (in_R8D == in_ESI) {
    pVar1 = quad_index2(p,a0_00,in_EDI,in_ESI,in_EDX);
  }
  else if (in_R8D == in_EDX) {
    pVar1 = quad_index2(p,a0_00,in_EDI,in_ESI,in_EDX);
  }
  else if (in_R9D == in_EDI) {
    pVar1 = quad_index2(p,a0_00,in_EDI,in_ESI,in_EDX);
  }
  else if (in_R9D == in_ESI) {
    pVar1 = quad_index2(p,a0_00,in_EDI,in_ESI,in_EDX);
  }
  else if (in_R9D == in_EDX) {
    pVar1 = quad_index2(p,a0_00,in_EDI,in_ESI,in_EDX);
  }
  else {
    pVar1 = std::make_pair<int,int>((int *)0xffffffff,(int *)0x1f276f);
  }
  return pVar1;
}

Assistant:

std::pair<int,int> quad_index3(int a0, int a1, int a2, int b0, int b1, int b2)
  {
    if      (b0 == a0) return quad_index2(0,a2,a1,b1,b2);
    else if (b0 == a1) return quad_index2(1,a0,a2,b1,b2);
    else if (b0 == a2) return quad_index2(2,a1,a0,b1,b2);
    else if (b1 == a0) return quad_index2(0,a2,a1,b0,b2);
    else if (b1 == a1) return quad_index2(1,a0,a2,b0,b2);
    else if (b1 == a2) return quad_index2(2,a1,a0,b0,b2);
    else if (b2 == a0) return quad_index2(0,a2,a1,b0,b1);
    else if (b2 == a1) return quad_index2(1,a0,a2,b0,b1);
    else if (b2 == a2) return quad_index2(2,a1,a0,b0,b1);
    else return std::make_pair(0,-1);
  }